

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GAServices.cc
# Opt level: O1

GlobalArray * __thiscall
GA::GAServices::createGA_Ghosts
          (GAServices *this,int type,int ndim,int *dims,int *width,char *array_name,int *chunk)

{
  GlobalArray *this_00;
  
  this_00 = (GlobalArray *)operator_new(4);
  GA::GlobalArray::GlobalArray(this_00,type,ndim,dims,width,array_name,chunk,'g');
  return this_00;
}

Assistant:

GA::GlobalArray * 
GA::GAServices::createGA_Ghosts(int type, int ndim, int dims[], int width[],
				char *array_name, int chunk[]) {
  /* last argument is a dummy argument, just to increase the count of the 
     number of arguments, inorder to avoid conflict in # of args */
  GA::GlobalArray * GA = new GA::GlobalArray(type, ndim, dims, width, 
					     array_name, chunk, 'g');
  return GA;
}